

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoded_string_vector.cc
# Opt level: O0

vector<absl::string_view,_std::allocator<absl::string_view>_> * __thiscall
s2coding::EncodedStringVector::Decode
          (vector<absl::string_view,_std::allocator<absl::string_view>_> *__return_storage_ptr__,
          EncodedStringVector *this)

{
  size_t __n;
  reference pvVar1;
  string_view sVar2;
  int local_38;
  int i;
  allocator<absl::string_view> local_22;
  undefined1 local_21;
  size_t local_20;
  size_t n;
  EncodedStringVector *this_local;
  vector<absl::string_view,_std::allocator<absl::string_view>_> *result;
  
  n = (size_t)this;
  this_local = (EncodedStringVector *)__return_storage_ptr__;
  __n = size(this);
  local_21 = 0;
  local_20 = __n;
  std::allocator<absl::string_view>::allocator(&local_22);
  std::vector<absl::string_view,_std::allocator<absl::string_view>_>::vector
            (__return_storage_ptr__,__n,&local_22);
  std::allocator<absl::string_view>::~allocator(&local_22);
  for (local_38 = 0; (ulong)(long)local_38 < local_20; local_38 = local_38 + 1) {
    sVar2 = operator[](this,local_38);
    pvVar1 = std::vector<absl::string_view,_std::allocator<absl::string_view>_>::operator[]
                       (__return_storage_ptr__,(long)local_38);
    pvVar1->ptr_ = sVar2.ptr_;
    pvVar1->length_ = sVar2.length_;
  }
  return __return_storage_ptr__;
}

Assistant:

vector<string_view> EncodedStringVector::Decode() const {
  size_t n = size();
  vector<string_view> result(n);
  for (int i = 0; i < n; ++i) {
    result[i] = (*this)[i];
  }
  return result;
}